

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

int CheckSlowModel(int info)

{
  size_t i;
  uint32_t family;
  uint32_t model;
  int info_local;
  
  if ((info >> 8 & 0xfU) == 6) {
    for (i = 0; i < 6; i = i + 1) {
      if (((int)(info & 0xf0000U) >> 0xc | info >> 4 & 0xfU) == (uint)"7JM\x1c&\'"[i]) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int CheckSlowModel(int info) {
  // Table listing display models with longer latencies for the bsr instruction
  // (ie 2 cycles vs 10/16 cycles) and some SSSE3 instructions like pshufb.
  // Refer to Intel 64 and IA-32 Architectures Optimization Reference Manual.
  static const uint8_t kSlowModels[] = {
    0x37, 0x4a, 0x4d,  // Silvermont Microarchitecture
    0x1c, 0x26, 0x27   // Atom Microarchitecture
  };
  const uint32_t model = ((info & 0xf0000) >> 12) | ((info >> 4) & 0xf);
  const uint32_t family = (info >> 8) & 0xf;
  if (family == 0x06) {
    size_t i;
    for (i = 0; i < sizeof(kSlowModels) / sizeof(kSlowModels[0]); ++i) {
      if (model == kSlowModels[i]) return 1;
    }
  }
  return 0;
}